

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

string * __thiscall
pbrt::TriangleMesh::ToString_abi_cxx11_(string *__return_storage_ptr__,TriangleMesh *this)

{
  int *args_2;
  Point3f *pPVar1;
  Normal3f *pNVar2;
  Vector3f *pVVar3;
  span<const_pbrt::Normal3<float>_> *in_RCX;
  span<const_pbrt::Point2<float>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  allocator<char> local_19d;
  allocator<char> local_19c;
  allocator<char> local_19b;
  allocator<char> local_19a;
  allocator<char> local_199;
  span<const_pbrt::Point2<float>_> *local_198;
  Vector3f *local_190;
  Normal3f *local_188;
  Point3f *local_180;
  string *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string np;
  int *local_90;
  long local_88;
  span<const_pbrt::Point2<float>_> *local_80;
  long local_78;
  Vector3f *local_70;
  long local_68;
  Normal3f *local_60;
  long local_58;
  Point3f *local_50;
  long local_48;
  int *local_40;
  span<const_pbrt::Normal3<float>_> *local_38;
  
  local_178 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&np,"(nullptr)",(allocator<char> *)&local_d0);
  if (this->vertexIndices == (int *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,(string *)&np);
  }
  else {
    in_RCX = (span<const_pbrt::Normal3<float>_> *)((long)this->nTriangles * 3);
    local_40 = this->vertexIndices;
    local_38 = in_RCX;
    StringPrintf<pstd::span<int_const>>
              (&local_d0,(pbrt *)0x4321b3,(char *)&local_40,(span<const_int> *)in_RCX);
  }
  pPVar1 = this->p;
  args_2 = &this->nVertices;
  if (pPVar1 == (Point3f *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,(char *)0x0,&local_199);
  }
  else {
    local_48 = (long)*args_2;
    local_50 = pPVar1;
    StringPrintf<pstd::span<pbrt::Point3<float>const>>
              (&local_f0,(pbrt *)0x4321b3,(char *)&local_50,
               (span<const_pbrt::Point3<float>_> *)in_RCX);
  }
  pNVar2 = this->n;
  local_180 = pPVar1;
  if (pNVar2 == (Normal3f *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,(char *)0x0,&local_19a);
  }
  else {
    local_58 = (long)*args_2;
    local_60 = pNVar2;
    StringPrintf<pstd::span<pbrt::Normal3<float>const>>
              (&local_110,(pbrt *)0x4321b3,(char *)&local_60,in_RCX);
  }
  pVVar3 = this->s;
  local_188 = pNVar2;
  if (pVVar3 == (Vector3f *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,(char *)0x0,&local_19b);
  }
  else {
    local_68 = (long)*args_2;
    local_70 = pVVar3;
    StringPrintf<pstd::span<pbrt::Vector3<float>const>>
              (&local_130,(pbrt *)0x4321b3,(char *)&local_70,
               (span<const_pbrt::Vector3<float>_> *)in_RCX);
  }
  args = (span<const_pbrt::Point2<float>_> *)this->uv;
  local_198 = args;
  local_190 = pVVar3;
  if (args == (span<const_pbrt::Point2<float>_> *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,(char *)0x0,&local_19c);
  }
  else {
    local_78 = (long)*args_2;
    local_80 = args;
    StringPrintf<pstd::span<pbrt::Point2<float>const>>
              (&local_150,(pbrt *)0x4321b3,(char *)&local_80,args);
  }
  if (this->faceIndices == (int *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,(char *)0x0,&local_19d);
  }
  else {
    local_88 = (long)this->nTriangles;
    local_90 = this->faceIndices;
    StringPrintf<pstd::span<int_const>>
              (&local_170,(pbrt *)0x4321b3,(char *)&local_90,(span<const_int> *)args);
  }
  StringPrintf<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (local_178,
             (pbrt *)
             "[ TriangleMesh reverseOrientation: %s transformSwapsHandedness: %s nTriangles: %d nVertices: %d vertexIndices: %s p: %s n: %s s: %s uv: %s faceIndices: %s ]"
             ,&this->reverseOrientation,&this->transformSwapsHandedness,(bool *)this,args_2,
             (int *)&local_d0,&local_f0,&local_110,&local_130,&local_150,&local_170,
             in_stack_fffffffffffffe58);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&np);
  return local_178;
}

Assistant:

std::string TriangleMesh::ToString() const {
    std::string np = "(nullptr)";
    return StringPrintf(
        "[ TriangleMesh reverseOrientation: %s transformSwapsHandedness: %s "
        "nTriangles: %d nVertices: %d vertexIndices: %s p: %s n: %s "
        "s: %s uv: %s faceIndices: %s ]",
        reverseOrientation, transformSwapsHandedness, nTriangles, nVertices,
        vertexIndices ? StringPrintf("%s", pstd::MakeSpan(vertexIndices, 3 * nTriangles))
                      : np,
        p ? StringPrintf("%s", pstd::MakeSpan(p, nVertices)) : nullptr,
        n ? StringPrintf("%s", pstd::MakeSpan(n, nVertices)) : nullptr,
        s ? StringPrintf("%s", pstd::MakeSpan(s, nVertices)) : nullptr,
        uv ? StringPrintf("%s", pstd::MakeSpan(uv, nVertices)) : nullptr,
        faceIndices ? StringPrintf("%s", pstd::MakeSpan(faceIndices, nTriangles))
                    : nullptr);
}